

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall bvh::v2::ThreadPool::ThreadPool(ThreadPool *this,size_t thread_count)

{
  this->busy_count_ = 0;
  this->should_stop_ = false;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->avail_);
  std::condition_variable::condition_variable(&this->done_);
  std::
  queue<std::function<void(unsigned_long)>,std::deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>>
  ::
  queue<std::deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>,void>
            (&this->tasks_);
  start(this,thread_count);
  return;
}

Assistant:

ThreadPool(size_t thread_count = 0) { start(thread_count); }